

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O2

bool __thiscall
crnlib::mip_level::convert(mip_level *this,pixel_format fmt,bool cook,pack_params *p)

{
  color_quad<unsigned_char,_int> *pcVar1;
  bool bVar2;
  uint y;
  int iVar3;
  component_flags cVar4;
  uint uVar5;
  image_u8 *piVar6;
  image<crnlib::color_quad<unsigned_char,_int>_> *this_00;
  uint uVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  mip_level *this_01;
  byte bVar11;
  uint uVar12;
  anon_union_4_3_dd316fa8_for_color_quad<unsigned_char,_int>_3 local_6c;
  image_u8 tmp_img;
  
  iVar3 = pixel_format_helpers::is_dxt(fmt);
  if (iVar3 != 0) {
    bVar2 = pack_to_dxt(this,fmt,cook,p);
    return bVar2;
  }
  tmp_img.m_width = 0;
  tmp_img.m_height = 0;
  tmp_img.m_pitch = 0;
  tmp_img.m_total = 0;
  tmp_img.m_comp_flags = 0xf;
  tmp_img.m_pPixels = (color_quad<unsigned_char,_int> *)0x0;
  tmp_img.m_pixel_buf.m_p = (color_quad<unsigned_char,_int> *)0x0;
  tmp_img.m_pixel_buf.m_size = 0;
  tmp_img.m_pixel_buf.m_capacity = 0;
  this_01 = this;
  piVar6 = get_unpacked_image(this,&tmp_img,1);
  this_00 = (image<crnlib::color_quad<unsigned_char,_int>_> *)
            crnlib_new<crnlib::image<crnlib::color_quad<unsigned_char,int>>>((crnlib *)this_01);
  cVar4 = pixel_format_helpers::get_component_flags(fmt);
  this_00->m_comp_flags = cVar4;
  local_6c.m_u32 = 0xff000000;
  bVar2 = image<crnlib::color_quad<unsigned_char,_int>_>::resize
                    (this_00,piVar6->m_width,piVar6->m_height,0xffffffff,
                     (color_quad<unsigned_char,_int> *)&local_6c.field_0);
  if (bVar2) {
    for (uVar5 = 0; uVar5 < piVar6->m_height; uVar5 = uVar5 + 1) {
      for (uVar7 = 0; uVar7 < piVar6->m_width; uVar7 = uVar7 + 1) {
        pcVar1 = piVar6->m_pPixels;
        uVar12 = piVar6->m_pitch * uVar5 + uVar7;
        bVar10 = pcVar1[uVar12].field_0.field_0.r;
        bVar9 = pcVar1[uVar12].field_0.field_0.g;
        bVar8 = pcVar1[uVar12].field_0.field_0.b;
        if (((fmt == PIXEL_FMT_A8) || (fmt == PIXEL_FMT_DXT5A)) && ((piVar6->m_comp_flags & 8) == 0)
           ) {
          bVar11 = (byte)((uint)bVar8 * 0x1d2f + (uint)bVar9 * 0x9646 + (uint)bVar10 * 0x4c8b +
                          0x8000 >> 0x10);
        }
        else {
          if ((this_00->m_comp_flags & 0x10) != 0) {
            bVar10 = (byte)((uint)bVar8 * 0x1d2f + (uint)bVar9 * 0x9646 + (uint)bVar10 * 0x4c8b +
                            0x8000 >> 0x10);
            bVar9 = bVar10;
            bVar8 = bVar10;
          }
          bVar11 = -((this_00->m_comp_flags & 8) == 0) | pcVar1[uVar12].field_0.field_0.a;
        }
        pcVar1 = this_00->m_pPixels;
        uVar12 = this_00->m_pitch * uVar5 + uVar7;
        pcVar1[uVar12].field_0.field_0.r = bVar10;
        pcVar1[uVar12].field_0.field_0.g = bVar9;
        pcVar1[uVar12].field_0.field_0.b = bVar8;
        pcVar1[uVar12].field_0.field_0.a = bVar11;
      }
    }
    assign(this,this_00,fmt,this->m_orient_flags);
  }
  vector<crnlib::color_quad<unsigned_char,_int>_>::~vector(&tmp_img.m_pixel_buf);
  return bVar2;
}

Assistant:

bool mip_level::convert(pixel_format fmt, bool cook, const dxt_image::pack_params& p) {
  if (pixel_format_helpers::is_dxt(fmt))
    return pack_to_dxt(fmt, cook, p);

  image_u8 tmp_img;
  image_u8* pImg = get_unpacked_image(tmp_img, cUnpackFlagUncook);

  image_u8* pImage = crnlib_new<image_u8>();
  pImage->set_comp_flags(pixel_format_helpers::get_component_flags(fmt));

  if (!pImage->resize(pImg->get_width(), pImg->get_height()))
    return false;

  for (uint y = 0; y < pImg->get_height(); y++) {
    for (uint x = 0; x < pImg->get_width(); x++) {
      color_quad_u8 c((*pImg)(x, y));

      if ((pixel_format_helpers::is_alpha_only(fmt)) && (!pImg->has_alpha())) {
        c.a = static_cast<uint8>(c.get_luma());
      } else {
        if (pImage->is_grayscale()) {
          uint8 g = static_cast<uint8>(c.get_luma());
          c.r = g;
          c.g = g;
          c.b = g;
        }

        if (!pImage->is_component_valid(3))
          c.a = 255;
      }

      (*pImage)(x, y) = c;
    }
  }

  assign(pImage, fmt, m_orient_flags);

  return true;
}